

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

void pybind11::raise_from(PyObject *type,char *message)

{
  long lVar1;
  PyObject *val;
  PyObject *tb;
  PyObject *exc;
  PyObject *val2;
  long *local_48;
  long *local_40;
  long *local_38;
  undefined8 local_30;
  
  local_38 = (long *)0x0;
  local_48 = (long *)0x0;
  local_30 = 0;
  local_40 = (long *)0x0;
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    __assert_fail("PyErr_Occurred()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/../detail/../pytypes.h"
                  ,0x323,"void pybind11::raise_from(PyObject *, const char *)");
  }
  PyErr_Fetch(&local_38,&local_48,&local_40);
  PyErr_NormalizeException(&local_38,&local_48,&local_40);
  if (local_40 != (long *)0x0) {
    PyException_SetTraceback(local_48);
    *local_40 = *local_40 + -1;
    if (*local_40 == 0) {
      _Py_Dealloc();
    }
  }
  *local_38 = *local_38 + -1;
  if (*local_38 == 0) {
    _Py_Dealloc();
  }
  lVar1 = PyErr_Occurred();
  if (lVar1 == 0) {
    PyErr_SetString(type,message);
    PyErr_Fetch(&local_38,&local_30,&local_40);
    PyErr_NormalizeException(&local_38,&local_30,&local_40);
    *local_48 = *local_48 + 1;
    PyException_SetCause(local_30);
    PyException_SetContext(local_30,local_48);
    PyErr_Restore(local_38,local_30,local_40);
    return;
  }
  __assert_fail("!PyErr_Occurred()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/pybind11/include/pybind11/detail/../detail/../pytypes.h"
                ,0x32b,"void pybind11::raise_from(PyObject *, const char *)");
}

Assistant:

inline void raise_from(PyObject *type, const char *message) {
    // Based on _PyErr_FormatVFromCause:
    // https://github.com/python/cpython/blob/467ab194fc6189d9f7310c89937c51abeac56839/Python/errors.c#L405
    // See https://github.com/pybind/pybind11/pull/2112 for details.
    PyObject *exc = nullptr, *val = nullptr, *val2 = nullptr, *tb = nullptr;

    assert(PyErr_Occurred());
    PyErr_Fetch(&exc, &val, &tb);
    PyErr_NormalizeException(&exc, &val, &tb);
    if (tb != nullptr) {
        PyException_SetTraceback(val, tb);
        Py_DECREF(tb);
    }
    Py_DECREF(exc);
    assert(!PyErr_Occurred());

    PyErr_SetString(type, message);

    PyErr_Fetch(&exc, &val2, &tb);
    PyErr_NormalizeException(&exc, &val2, &tb);
    Py_INCREF(val);
    PyException_SetCause(val2, val);
    PyException_SetContext(val2, val);
    PyErr_Restore(exc, val2, tb);
}